

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tanh_sinh_detail.hpp
# Opt level: O2

void __thiscall
boost::math::quadrature::detail::
tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
::extend_refinements
          (tanh_sinh_detail<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_boost::math::policies::policy<boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy,_boost::math::policies::default_policy>_>
           *this)

{
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  *t;
  uint uVar1;
  pointer pvVar2;
  type_conflict6 tVar3;
  type_conflict6 tVar4;
  int iVar5;
  unsigned_long local_1e0;
  cpp_dec_float<100U,_int,_void> local_1c8;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  h;
  mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
  local_120;
  cpp_dec_float<100U,_int,_void> local_d0;
  type local_80;
  
  std::mutex::lock(&(this->m_mutex).m_);
  if ((ulong)(this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i <
      this->m_max_refinements) {
    LOCK();
    (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i =
         (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i + 1;
    UNLOCK();
    uVar1 = (this->m_committed_refinements).super___atomic_base<unsigned_int>._M_i;
    multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
              (&local_1c8,1,(type *)0x0);
    ldexp<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
              (&h,(mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&local_1c8,-uVar1);
    t = &this->m_t_max;
    operator-(&local_120,t,&h);
    ::operator*(&local_80,2,&h);
    operator/((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
               *)&local_d0,&local_120,&local_80);
    ceil<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>
              ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_1c8,
               (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                *)&local_d0);
    iVar5 = itrunc<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                      ((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                        *)&local_1c8);
    std::
    vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
    ::reserve((this->m_abscissas).
              super__Vector_base<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::allocator<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar1,(long)iVar5);
    std::
    vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>
    ::reserve((this->m_weights).
              super__Vector_base<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::allocator<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + uVar1,(long)iVar5);
    local_1c8.data._M_elems[0xc] = h.base.m_backend.data._M_elems[0xc];
    local_1c8.data._M_elems[0xd] = h.base.m_backend.data._M_elems[0xd];
    local_1c8.data._M_elems[0xe] = h.base.m_backend.data._M_elems[0xe];
    local_1c8.data._M_elems[0xf] = h.base.m_backend.data._M_elems[0xf];
    local_1c8.data._M_elems[8] = h.base.m_backend.data._M_elems[8];
    local_1c8.data._M_elems[9] = h.base.m_backend.data._M_elems[9];
    local_1c8.data._M_elems[10] = h.base.m_backend.data._M_elems[10];
    local_1c8.data._M_elems[0xb] = h.base.m_backend.data._M_elems[0xb];
    local_1c8.data._M_elems[4] = h.base.m_backend.data._M_elems[4];
    local_1c8.data._M_elems[5] = h.base.m_backend.data._M_elems[5];
    local_1c8.data._M_elems[6] = h.base.m_backend.data._M_elems[6];
    local_1c8.data._M_elems[7] = h.base.m_backend.data._M_elems[7];
    local_1c8.data._M_elems[0] = h.base.m_backend.data._M_elems[0];
    local_1c8.data._M_elems[1] = h.base.m_backend.data._M_elems[1];
    local_1c8.data._M_elems[2] = h.base.m_backend.data._M_elems[2];
    local_1c8.data._M_elems[3] = h.base.m_backend.data._M_elems[3];
    local_1c8.exp = h.base.m_backend.exp;
    local_1c8.neg = h.base.m_backend.neg;
    local_1c8.fpclass = h.base.m_backend.fpclass;
    local_1c8.prec_elem = h.base.m_backend.prec_elem;
    local_1e0 = 0;
    while (tVar3 = multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                               *)&local_1c8,&t->base), tVar3) {
      tVar3 = multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                          *)&local_1c8,&(this->m_t_crossover).base);
      pvVar2 = (this->m_abscissas).
               super__Vector_base<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::allocator<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      tVar4 = multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                          *)&local_1c8,&(this->m_t_crossover).base);
      if (tVar4) {
        abscissa_at_t((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_d0,
                      (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                       *)&local_1c8);
      }
      else {
        abscissa_complement_at_t
                  (&local_120,
                   (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                    *)&local_1c8);
        operator-((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&local_d0,&local_120);
      }
      std::
      vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>>
      ::
      emplace_back<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                ((vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>>
                  *)(pvVar2 + uVar1),
                 (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *)&local_d0);
      ::operator*((type *)&local_d0,2,&h);
      multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=(&local_1c8,&local_d0);
      local_1e0 = local_1e0 + tVar3;
    }
    (this->m_first_complements).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
    _M_impl.super__Vector_impl_data._M_start[uVar1] = local_1e0;
    local_1c8.data._M_elems[0xc] = h.base.m_backend.data._M_elems[0xc];
    local_1c8.data._M_elems[0xd] = h.base.m_backend.data._M_elems[0xd];
    local_1c8.data._M_elems[0xe] = h.base.m_backend.data._M_elems[0xe];
    local_1c8.data._M_elems[0xf] = h.base.m_backend.data._M_elems[0xf];
    local_1c8.data._M_elems[8] = h.base.m_backend.data._M_elems[8];
    local_1c8.data._M_elems[9] = h.base.m_backend.data._M_elems[9];
    local_1c8.data._M_elems[10] = h.base.m_backend.data._M_elems[10];
    local_1c8.data._M_elems[0xb] = h.base.m_backend.data._M_elems[0xb];
    local_1c8.data._M_elems[4] = h.base.m_backend.data._M_elems[4];
    local_1c8.data._M_elems[5] = h.base.m_backend.data._M_elems[5];
    local_1c8.data._M_elems[6] = h.base.m_backend.data._M_elems[6];
    local_1c8.data._M_elems[7] = h.base.m_backend.data._M_elems[7];
    local_1c8.data._M_elems[0] = h.base.m_backend.data._M_elems[0];
    local_1c8.data._M_elems[1] = h.base.m_backend.data._M_elems[1];
    local_1c8.data._M_elems[2] = h.base.m_backend.data._M_elems[2];
    local_1c8.data._M_elems[3] = h.base.m_backend.data._M_elems[3];
    local_1c8.exp = h.base.m_backend.exp;
    local_1c8.neg = h.base.m_backend.neg;
    local_1c8.fpclass = h.base.m_backend.fpclass;
    local_1c8.prec_elem = h.base.m_backend.prec_elem;
    while (tVar3 = multiprecision::operator<
                             ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                               *)&local_1c8,&t->base), tVar3) {
      pvVar2 = (this->m_weights).
               super__Vector_base<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>,_std::allocator<std::vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>,_std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      weight_at_t((mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&local_d0,
                  (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                   *)&local_1c8);
      std::
      vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>>
      ::
      emplace_back<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>
                ((vector<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>,std::allocator<mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)1>>>>
                  *)(pvVar2 + uVar1),
                 (mp_wrapper<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)1>_>
                  *)&local_d0);
      ::operator*((type *)&local_d0,2,&h);
      multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=(&local_1c8,&local_d0);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_mutex);
  return;
}

Assistant:

void extend_refinements()const
   {
#ifndef BOOST_MATH_NO_ATOMIC_INT
      boost::detail::lightweight_mutex::scoped_lock guard(m_mutex);
#endif
      //
      // Check some other thread hasn't got here after we read the atomic variable, but before we got here:
      //
#ifndef BOOST_MATH_NO_ATOMIC_INT
      if (m_committed_refinements.load() >= m_max_refinements)
         return;
#else
      if (m_committed_refinements >= m_max_refinements)
         return;
#endif

      using std::ldexp;
      using std::ceil;
      ++m_committed_refinements;
#ifndef BOOST_MATH_NO_ATOMIC_INT
      std::size_t row = m_committed_refinements.load();
#else
      std::size_t row = m_committed_refinements;
#endif
      Real h = ldexp(Real(1), -static_cast<int>(row));
      std::size_t first_complement = 0;
      std::size_t n = boost::math::itrunc(ceil((m_t_max - h) / (2 * h)));
      m_abscissas[row].reserve(n);
      m_weights[row].reserve(n);
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
      {
         if (pos < m_t_crossover)
            ++first_complement;
         m_abscissas[row].push_back(pos < m_t_crossover ? abscissa_at_t(pos) : -abscissa_complement_at_t(pos));
      }
      m_first_complements[row] = first_complement;
      for (Real pos = h; pos < m_t_max; pos += 2 * h)
         m_weights[row].push_back(weight_at_t(pos));
   }